

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O1

void __thiscall deqp::gls::FragmentOpUtil::QuadRenderer::render(QuadRenderer *this,Quad *quad)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint8 indices [6];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  float position [16];
  undefined4 local_160;
  undefined2 local_15c;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_158;
  VertexArrayBinding local_138;
  float local_e8;
  float local_e4;
  float local_e0;
  undefined4 local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  undefined4 local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  undefined4 local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  undefined4 local_ac;
  
  local_e8 = (quad->posA).m_data[0];
  local_138.pointer.data = &local_e8;
  local_e4 = (quad->posA).m_data[1];
  local_e0 = quad->depth[0];
  local_dc = 0x3f800000;
  local_d4 = (quad->posB).m_data[1];
  local_d0 = quad->depth[1];
  local_cc = 0x3f800000;
  local_c8 = (quad->posB).m_data[0];
  local_c0 = quad->depth[2];
  local_bc = 0x3f800000;
  local_b0 = quad->depth[3];
  local_ac = 0x3f800000;
  local_15c = 0x302;
  local_160 = 0x1010200;
  local_158.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_158.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.binding.location = this->m_positionLoc;
  paVar1 = &local_138.binding.name.field_2;
  local_138.binding._0_8_ = local_138.binding._0_8_ & 0xffffffff00000000;
  local_138.binding.name._M_string_length = 0;
  local_138.binding.name.field_2._M_local_buf[0] = '\0';
  local_138.pointer.componentType = VTX_COMP_FLOAT;
  local_138.pointer.convert = VTX_COMP_CONVERT_NONE;
  local_138.pointer.numComponents = 4;
  local_138.pointer.numElements = 4;
  local_138.pointer.stride = 0;
  local_138.binding.name._M_dataplus._M_p = (pointer)paVar1;
  local_d8 = local_e8;
  local_c4 = local_e4;
  local_b8 = local_c8;
  local_b4 = local_d4;
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_158,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.binding.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.binding.name._M_dataplus._M_p,
                    CONCAT71(local_138.binding.name.field_2._M_allocated_capacity._1_7_,
                             local_138.binding.name.field_2._M_local_buf[0]) + 1);
  }
  local_138.binding.location = this->m_colorLoc;
  local_138.pointer.data = quad->color;
  local_138.binding._0_8_ = local_138.binding._0_8_ & 0xffffffff00000000;
  local_138.binding.name._M_string_length = 0;
  local_138.binding.name.field_2._M_local_buf[0] = '\0';
  local_138.pointer.componentType = VTX_COMP_FLOAT;
  local_138.pointer.convert = VTX_COMP_CONVERT_NONE;
  local_138.pointer.numComponents = 4;
  local_138.pointer.numElements = 4;
  local_138.pointer.stride = 0;
  local_138.binding.name._M_dataplus._M_p = (pointer)paVar1;
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_158,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.binding.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.binding.name._M_dataplus._M_p,
                    CONCAT71(local_138.binding.name.field_2._M_allocated_capacity._1_7_,
                             local_138.binding.name.field_2._M_local_buf[0]) + 1);
  }
  if (this->m_blendFuncExt == true) {
    local_138.binding.location = this->m_color1Loc;
    local_138.pointer.data = quad->color1;
    local_138.binding._0_8_ = local_138.binding._0_8_ & 0xffffffff00000000;
    local_138.binding.name._M_string_length = 0;
    local_138.binding.name.field_2._M_local_buf[0] = '\0';
    local_138.pointer.componentType = VTX_COMP_FLOAT;
    local_138.pointer.convert = VTX_COMP_CONVERT_NONE;
    local_138.pointer.numComponents = 4;
    local_138.pointer.numElements = 4;
    local_138.pointer.stride = 0;
    local_138.binding.name._M_dataplus._M_p = (pointer)paVar1;
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>(&local_158,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.binding.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_138.binding.name._M_dataplus._M_p,
                      CONCAT71(local_138.binding.name.field_2._M_allocated_capacity._1_7_,
                               local_138.binding.name.field_2._M_local_buf[0]) + 1);
    }
  }
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1680))((this->m_program->m_program).m_program);
  local_138.binding.type = TYPE_LOCATION;
  local_138.binding._4_4_ = 6;
  local_138.binding.name._M_dataplus._M_p =
       local_138.binding.name._M_dataplus._M_p & 0xffffffff00000000;
  local_138.binding.name._M_string_length = (size_type)&local_160;
  glu::draw(this->m_context,(this->m_program->m_program).m_program,
            (int)((ulong)((long)local_158.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_158.
                               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,
            local_158.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)&local_138,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&local_158);
  return;
}

Assistant:

void QuadRenderer::render (const Quad& quad) const
{
	const float position[] =
	{
		quad.posA.x(), quad.posA.y(), quad.depth[0], 1.0f,
		quad.posA.x(), quad.posB.y(), quad.depth[1], 1.0f,
		quad.posB.x(), quad.posA.y(), quad.depth[2], 1.0f,
		quad.posB.x(), quad.posB.y(), quad.depth[3], 1.0f
	};
	const deUint8 indices[] = { 0, 2, 1, 1, 2, 3 };

	DE_STATIC_ASSERT(sizeof(tcu::Vec4) == sizeof(float)*4);
	DE_STATIC_ASSERT(sizeof(quad.color) == sizeof(float)*4*4);
	DE_STATIC_ASSERT(sizeof(quad.color1) == sizeof(float)*4*4);

	std::vector<glu::VertexArrayBinding> vertexArrays;

	vertexArrays.push_back(glu::va::Float(m_positionLoc,	4, 4, 0, &position[0]));
	vertexArrays.push_back(glu::va::Float(m_colorLoc,		4, 4, 0, (const float*)&quad.color[0]));

	if (m_blendFuncExt)
		vertexArrays.push_back(glu::va::Float(m_color1Loc,	4, 4, 0, (const float*)&quad.color1[0]));

	m_context.getFunctions().useProgram(m_program->getProgram());
	glu::draw(m_context, m_program->getProgram(),
			  (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
}